

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

Result<wallet::SelectionResult> *
wallet::SelectCoinsBnB
          (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *utxo_pool,
          CAmount *selection_target,CAmount *cost_of_change,int max_selection_weight)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  iterator iVar5;
  iterator iVar6;
  reference pvVar7;
  reference pvVar8;
  CAmount CVar9;
  CAmount CVar10;
  long *in_RCX;
  long *in_RDX;
  Result<wallet::SelectionResult> *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  size_t *i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  OutputGroup *utxo_2;
  OutputGroup *utxo_1;
  bool backtrack;
  size_t curr_try;
  bool max_tx_weight_exceeded;
  bool is_feerate_high;
  CAmount best_waste;
  CAmount curr_waste;
  OutputGroup *utxo;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *__range1;
  CAmount curr_available_value;
  int curr_selection_weight;
  CAmount curr_value;
  iterator __end1_1;
  iterator __begin1_1;
  size_t utxo_pool_index;
  vector<unsigned_long,_std::allocator<unsigned_long>_> best_selection;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> curr_selection;
  SelectionResult result;
  undefined7 in_stack_fffffffffffffc88;
  SelectionAlgorithm in_stack_fffffffffffffc8f;
  T *in_stack_fffffffffffffc90;
  SelectionResult *in_stack_fffffffffffffc98;
  CAmount in_stack_fffffffffffffcb8;
  CAmount in_stack_fffffffffffffcc0;
  CAmount in_stack_fffffffffffffcc8;
  SelectionResult *in_stack_fffffffffffffcd0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd20;
  reference in_stack_fffffffffffffd28;
  ulong local_258;
  long local_248;
  long local_240;
  long local_200;
  int local_1f4;
  long local_1f0;
  ulong local_1b0;
  SelectionResult local_168;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SelectionResult::SelectionResult
            (in_stack_fffffffffffffc98,(CAmount)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8f)
  ;
  local_1f0 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  local_1f4 = 0;
  local_200 = 0;
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::begin
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             in_stack_fffffffffffffc90);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::end
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             in_stack_fffffffffffffc90);
  while (bVar3 = __gnu_cxx::
                 operator==<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                           ((__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                             *)in_stack_fffffffffffffc98,
                            (__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                             *)in_stack_fffffffffffffc90), ((bVar3 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
    ::operator*((__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                 *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    CVar9 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc98);
    if (CVar9 < 1) {
      __assert_fail("utxo.GetSelectionAmount() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
                    ,0x6a,
                    "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                   );
    }
    CVar9 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc98);
    local_200 = CVar9 + local_200;
    __gnu_cxx::
    __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
    ::operator++((__normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
                  *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  }
  if (local_200 < *in_RDX) {
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    util::Error::Error((Error *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    util::Result<wallet::SelectionResult>::Result
              ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffc98,
               (Error *)in_stack_fffffffffffffc90);
    util::Error::~Error((Error *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  }
  else {
    iVar5 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::begin
                      ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                       in_stack_fffffffffffffc90);
    iVar6 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::end
                      ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                       in_stack_fffffffffffffc90);
    std::
    sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,wallet::__0>
              (iVar5._M_current,iVar6._M_current);
    local_240 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    local_248 = 2100000000000000;
    pvVar7 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                       ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                        in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
    lVar1 = pvVar7->fee;
    pvVar7 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                       ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                        in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
    lVar2 = pvVar7->long_term_fee;
    bVar3 = false;
    local_1b0 = 0;
    for (local_258 = 0; local_258 < 100000; local_258 = local_258 + 1) {
      bVar4 = false;
      if (((local_1f0 + local_200 < *in_RDX) || (*in_RDX + *in_RCX < local_1f0)) ||
         ((local_248 < local_240 && (lVar2 < lVar1)))) {
        bVar4 = true;
      }
      else if (in_R8D < local_1f4) {
        bVar3 = true;
        bVar4 = true;
      }
      else if (*in_RDX <= local_1f0) {
        local_240 = (local_1f0 - *in_RDX) + local_240;
        if (local_240 <= local_248) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
          local_248 = local_240;
        }
        local_240 = local_240 - (local_1f0 - *in_RDX);
        bVar4 = true;
      }
      if (bVar4) {
        bVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffc98);
        if (bVar4) break;
        while( true ) {
          local_1b0 = local_1b0 - 1;
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
          if (local_1b0 <= *pvVar8) break;
          in_stack_fffffffffffffd28 =
               std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                         ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                          in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
          in_stack_fffffffffffffd20 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc98);
          local_200 = (long)&(in_stack_fffffffffffffd20->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start + local_200;
        }
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
        if (local_1b0 != *pvVar8) {
          __assert_fail("utxo_pool_index == curr_selection.back()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
                        ,0x9f,
                        "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                       );
        }
        pvVar7 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                           ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                            in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
        CVar9 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc98);
        local_1f0 = local_1f0 - CVar9;
        local_240 = local_240 - (pvVar7->fee - pvVar7->long_term_fee);
        local_1f4 = local_1f4 - pvVar7->m_weight;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
      }
      else {
        pvVar7 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                           ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                            in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
        CVar9 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc98);
        local_200 = local_200 - CVar9;
        bVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffc98);
        if ((!bVar4) &&
           (pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88)),
           local_1b0 - 1 != *pvVar8)) {
          CVar9 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc98);
          std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                    ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                     in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
          CVar10 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc98);
          if (CVar9 == CVar10) {
            in_stack_fffffffffffffcc8 = pvVar7->fee;
            in_stack_fffffffffffffcd0 =
                 (SelectionResult *)
                 std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                           ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                            in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
            if (in_stack_fffffffffffffcc8 ==
                *(long *)&(in_stack_fffffffffffffcd0->m_waste).
                          super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._M_engaged) goto LAB_00baeafd;
          }
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffc98,(value_type_conflict5 *)in_stack_fffffffffffffc90);
        in_stack_fffffffffffffcc0 =
             OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc98);
        local_1f0 = in_stack_fffffffffffffcc0 + local_1f0;
        local_240 = (pvVar7->fee - pvVar7->long_term_fee) + local_240;
        local_1f4 = pvVar7->m_weight + local_1f4;
      }
LAB_00baeafd:
      local_1b0 = local_1b0 + 1;
    }
    bVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffc98);
    if (bVar4) {
      if (bVar3) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_c8 = 0;
        uStack_c0 = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        local_f8 = 0;
        uStack_f0 = 0;
        util::Error::Error((Error *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
        util::Result<wallet::SelectionResult>::Result
                  ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffc98,
                   (Error *)in_stack_fffffffffffffc90);
        util::Error::~Error((Error *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
      }
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc90)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc90)
      ;
      while (bVar3 = __gnu_cxx::
                     operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffc98,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffc90), ((bVar3 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
        std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::at
                  ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                   in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
        SelectionResult::AddInput
                  (in_stack_fffffffffffffc98,(OutputGroup *)in_stack_fffffffffffffc90);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
      }
      SelectionResult::RecalculateWaste
                (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                 in_stack_fffffffffffffcb8);
      CVar9 = SelectionResult::GetWaste
                        ((SelectionResult *)
                         CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
      if (local_248 != CVar9) {
        __assert_fail("best_waste == result.GetWaste()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
                      ,0xc6,
                      "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                     );
      }
      in_stack_fffffffffffffc98 = &local_168;
      SelectionResult::SelectionResult(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
      util::Result<wallet::SelectionResult>::Result
                ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffc98,
                 in_stack_fffffffffffffc90);
      SelectionResult::~SelectionResult
                ((SelectionResult *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc98);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc98);
  SelectionResult::~SelectionResult
            ((SelectionResult *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<SelectionResult> SelectCoinsBnB(std::vector<OutputGroup>& utxo_pool, const CAmount& selection_target, const CAmount& cost_of_change,
                                             int max_selection_weight)
{
    SelectionResult result(selection_target, SelectionAlgorithm::BNB);
    CAmount curr_value = 0;
    std::vector<size_t> curr_selection; // selected utxo indexes
    int curr_selection_weight = 0; // sum of selected utxo weight

    // Calculate curr_available_value
    CAmount curr_available_value = 0;
    for (const OutputGroup& utxo : utxo_pool) {
        // Assert that this utxo is not negative. It should never be negative,
        // effective value calculation should have removed it
        assert(utxo.GetSelectionAmount() > 0);
        curr_available_value += utxo.GetSelectionAmount();
    }
    if (curr_available_value < selection_target) {
        return util::Error();
    }

    // Sort the utxo_pool
    std::sort(utxo_pool.begin(), utxo_pool.end(), descending);

    CAmount curr_waste = 0;
    std::vector<size_t> best_selection;
    CAmount best_waste = MAX_MONEY;

    bool is_feerate_high = utxo_pool.at(0).fee > utxo_pool.at(0).long_term_fee;
    bool max_tx_weight_exceeded = false;

    // Depth First search loop for choosing the UTXOs
    for (size_t curr_try = 0, utxo_pool_index = 0; curr_try < TOTAL_TRIES; ++curr_try, ++utxo_pool_index) {
        // Conditions for starting a backtrack
        bool backtrack = false;
        if (curr_value + curr_available_value < selection_target || // Cannot possibly reach target with the amount remaining in the curr_available_value.
            curr_value > selection_target + cost_of_change || // Selected value is out of range, go back and try other branch
            (curr_waste > best_waste && is_feerate_high)) { // Don't select things which we know will be more wasteful if the waste is increasing
            backtrack = true;
        } else if (curr_selection_weight > max_selection_weight) { // Selected UTXOs weight exceeds the maximum weight allowed, cannot find more solutions by adding more inputs
            max_tx_weight_exceeded = true; // at least one selection attempt exceeded the max weight
            backtrack = true;
        } else if (curr_value >= selection_target) {       // Selected value is within range
            curr_waste += (curr_value - selection_target); // This is the excess value which is added to the waste for the below comparison
            // Adding another UTXO after this check could bring the waste down if the long term fee is higher than the current fee.
            // However we are not going to explore that because this optimization for the waste is only done when we have hit our target
            // value. Adding any more UTXOs will be just burning the UTXO; it will go entirely to fees. Thus we aren't going to
            // explore any more UTXOs to avoid burning money like that.
            if (curr_waste <= best_waste) {
                best_selection = curr_selection;
                best_waste = curr_waste;
            }
            curr_waste -= (curr_value - selection_target); // Remove the excess value as we will be selecting different coins now
            backtrack = true;
        }

        if (backtrack) { // Backtracking, moving backwards
            if (curr_selection.empty()) { // We have walked back to the first utxo and no branch is untraversed. All solutions searched
                break;
            }

            // Add omitted UTXOs back to lookahead before traversing the omission branch of last included UTXO.
            for (--utxo_pool_index; utxo_pool_index > curr_selection.back(); --utxo_pool_index) {
                curr_available_value += utxo_pool.at(utxo_pool_index).GetSelectionAmount();
            }

            // Output was included on previous iterations, try excluding now.
            assert(utxo_pool_index == curr_selection.back());
            OutputGroup& utxo = utxo_pool.at(utxo_pool_index);
            curr_value -= utxo.GetSelectionAmount();
            curr_waste -= utxo.fee - utxo.long_term_fee;
            curr_selection_weight -= utxo.m_weight;
            curr_selection.pop_back();
        } else { // Moving forwards, continuing down this branch
            OutputGroup& utxo = utxo_pool.at(utxo_pool_index);

            // Remove this utxo from the curr_available_value utxo amount
            curr_available_value -= utxo.GetSelectionAmount();

            if (curr_selection.empty() ||
                // The previous index is included and therefore not relevant for exclusion shortcut
                (utxo_pool_index - 1) == curr_selection.back() ||
                // Avoid searching a branch if the previous UTXO has the same value and same waste and was excluded.
                // Since the ratio of fee to long term fee is the same, we only need to check if one of those values match in order to know that the waste is the same.
                utxo.GetSelectionAmount() != utxo_pool.at(utxo_pool_index - 1).GetSelectionAmount() ||
                utxo.fee != utxo_pool.at(utxo_pool_index - 1).fee)
            {
                // Inclusion branch first (Largest First Exploration)
                curr_selection.push_back(utxo_pool_index);
                curr_value += utxo.GetSelectionAmount();
                curr_waste += utxo.fee - utxo.long_term_fee;
                curr_selection_weight += utxo.m_weight;
            }
        }
    }

    // Check for solution
    if (best_selection.empty()) {
        return max_tx_weight_exceeded ? ErrorMaxWeightExceeded() : util::Error();
    }

    // Set output set
    for (const size_t& i : best_selection) {
        result.AddInput(utxo_pool.at(i));
    }
    result.RecalculateWaste(cost_of_change, cost_of_change, CAmount{0});
    assert(best_waste == result.GetWaste());

    return result;
}